

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vint4_sse2.h
# Opt level: O3

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::ObjectIntersectorK<4,_false>_>,_false>
     ::intersectCoherent(vint<4> *valid_i,Intersectors *This,RayHitK<4> *ray,
                        RayQueryContext *context)

{
  float *pfVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  StackItemT<embree::NodeRefPtr<4>_> SVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  AccelData *pAVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [12];
  undefined4 in_EAX;
  uint uVar16;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar17;
  long lVar18;
  _func_int **pp_Var19;
  undefined4 uVar20;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar21;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar22;
  ulong uVar23;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar24;
  long lVar25;
  ulong uVar26;
  ulong uVar27;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar28;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar29;
  ulong uVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  float fVar67;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  float fVar68;
  float fVar77;
  float fVar79;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  uint uVar78;
  uint uVar80;
  float fVar81;
  uint uVar82;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  float fVar83;
  uint uVar84;
  float fVar89;
  uint uVar90;
  float fVar91;
  uint uVar92;
  vint4 bi;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  float fVar93;
  uint uVar94;
  vint4 bi_1;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  float fVar103;
  undefined1 auVar102 [16];
  float fVar104;
  float fVar111;
  float fVar112;
  vint4 ai;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  float fVar113;
  undefined1 auVar110 [16];
  float fVar114;
  float fVar115;
  float fVar116;
  vint4 ai_1;
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  vint4 ai_3;
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  vint4 bi_4;
  float fVar128;
  uint uVar129;
  uint uVar133;
  uint uVar134;
  vint4 bi_3;
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  uint uVar135;
  undefined1 auVar132 [16];
  uint uVar136;
  uint uVar140;
  uint uVar141;
  vint4 ai_2;
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  uint uVar142;
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar150;
  float fVar151;
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  float fVar156;
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  vint<4> octant;
  vint4 bi_9;
  undefined1 local_11a8 [16];
  RTCIntersectFunctionNArguments local_1198;
  Geometry *local_1168;
  undefined8 local_1160;
  RTCIntersectArguments *local_1158;
  undefined1 local_1148 [16];
  float local_1138;
  float fStack_1134;
  float fStack_1130;
  float fStack_112c;
  undefined1 local_1128 [16];
  vfloat<4> fmin;
  undefined1 local_10b8 [16];
  undefined1 local_10a8 [16];
  undefined1 local_1098 [16];
  undefined1 local_1088 [16];
  float local_1078;
  float fStack_1074;
  float fStack_1070;
  float fStack_106c;
  float local_1068;
  float fStack_1064;
  float fStack_1060;
  float fStack_105c;
  float local_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  float local_1048;
  float fStack_1044;
  float fStack_1040;
  float fStack_103c;
  undefined1 local_1038 [16];
  float local_1028;
  float fStack_1024;
  float fStack_1020;
  float fStack_101c;
  float local_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  float local_f88;
  float fStack_f84;
  float fStack_f80;
  float fStack_f7c;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  
  bi_1.field_0.i[2] = 0xffffffff;
  bi_1.field_0.v[0] = 0xffffffffffffffff;
  bi_1.field_0.i[3] = 0xffffffff;
  auVar85._0_4_ = -(uint)((valid_i->field_0).i[0] == -1);
  auVar85._4_4_ = -(uint)((valid_i->field_0).i[1] == -1);
  auVar85._8_4_ = -(uint)((valid_i->field_0).i[2] == -1);
  auVar85._12_4_ = -(uint)((valid_i->field_0).i[3] == -1);
  uVar16 = movmskps(in_EAX,auVar85);
  if (uVar16 != 0) {
    pAVar7 = This->ptr;
    pSVar21 = (StackItemT<embree::NodeRefPtr<4>_> *)(ulong)(uVar16 & 0xff);
    fVar145 = *(float *)ray;
    fVar146 = *(float *)(ray + 4);
    fVar147 = *(float *)(ray + 8);
    fVar148 = *(float *)(ray + 0xc);
    fVar149 = *(float *)(ray + 0x10);
    fVar150 = *(float *)(ray + 0x14);
    fVar151 = *(float *)(ray + 0x18);
    fVar152 = *(float *)(ray + 0x1c);
    fVar153 = *(float *)(ray + 0x20);
    fVar154 = *(float *)(ray + 0x24);
    fVar155 = *(float *)(ray + 0x28);
    fVar156 = *(float *)(ray + 0x2c);
    auVar87 = *(undefined1 (*) [16])(ray + 0x40);
    fVar122 = (float)DAT_01f80d30;
    fVar124 = DAT_01f80d30._4_4_;
    fVar126 = DAT_01f80d30._8_4_;
    fVar128 = DAT_01f80d30._12_4_;
    auVar105._4_4_ = -(uint)(ABS(auVar87._4_4_) < fVar124);
    auVar105._0_4_ = -(uint)(ABS(auVar87._0_4_) < fVar122);
    auVar105._8_4_ = -(uint)(ABS(auVar87._8_4_) < fVar126);
    auVar105._12_4_ = -(uint)(ABS(auVar87._12_4_) < fVar128);
    auVar130 = blendvps(auVar87,_DAT_01f80d30,auVar105);
    auVar105 = *(undefined1 (*) [16])(ray + 0x50);
    auVar106._4_4_ = -(uint)(ABS(auVar105._4_4_) < fVar124);
    auVar106._0_4_ = -(uint)(ABS(auVar105._0_4_) < fVar122);
    auVar106._8_4_ = -(uint)(ABS(auVar105._8_4_) < fVar126);
    auVar106._12_4_ = -(uint)(ABS(auVar105._12_4_) < fVar128);
    auVar137 = blendvps(auVar105,_DAT_01f80d30,auVar106);
    auVar106 = *(undefined1 (*) [16])(ray + 0x60);
    auVar157._4_4_ = -(uint)(ABS(auVar106._4_4_) < fVar124);
    auVar157._0_4_ = -(uint)(ABS(auVar106._0_4_) < fVar122);
    auVar157._8_4_ = -(uint)(ABS(auVar106._8_4_) < fVar126);
    auVar157._12_4_ = -(uint)(ABS(auVar106._12_4_) < fVar128);
    auVar143 = blendvps(auVar106,_DAT_01f80d30,auVar157);
    auVar35 = rcpps(auVar157,auVar130);
    fVar122 = auVar35._0_4_;
    fVar124 = auVar35._4_4_;
    fVar67 = auVar35._8_4_;
    fVar68 = auVar35._12_4_;
    auVar144._4_4_ = (1.0 - auVar130._4_4_ * fVar124) * fVar124 + fVar124;
    auVar144._0_4_ = (1.0 - auVar130._0_4_ * fVar122) * fVar122 + fVar122;
    auVar35 = rcpps(auVar35,auVar137);
    fVar122 = auVar35._0_4_;
    fVar124 = auVar35._4_4_;
    fVar126 = auVar35._8_4_;
    fVar128 = auVar35._12_4_;
    local_1098._0_8_ =
         CONCAT44((1.0 - auVar137._4_4_ * fVar124) * fVar124 + fVar124,
                  (1.0 - auVar137._0_4_ * fVar122) * fVar122 + fVar122);
    local_1098._8_4_ = (1.0 - auVar137._8_4_ * fVar126) * fVar126 + fVar126;
    local_1098._12_4_ = (1.0 - auVar137._12_4_ * fVar128) * fVar128 + fVar128;
    auVar35 = rcpps(auVar35,auVar143);
    fVar122 = auVar35._0_4_;
    fVar124 = auVar35._4_4_;
    fVar126 = auVar35._8_4_;
    fVar128 = auVar35._12_4_;
    auVar144._8_4_ = (1.0 - auVar130._8_4_ * fVar67) * fVar67 + fVar67;
    auVar144._12_4_ = (1.0 - auVar130._12_4_ * fVar68) * fVar68 + fVar68;
    fVar122 = (1.0 - auVar143._0_4_ * fVar122) * fVar122 + fVar122;
    fVar124 = (1.0 - auVar143._4_4_ * fVar124) * fVar124 + fVar124;
    fVar126 = (1.0 - auVar143._8_4_ * fVar126) * fVar126 + fVar126;
    fVar128 = (1.0 - auVar143._12_4_ * fVar128) * fVar128 + fVar128;
    auVar130._0_12_ = ZEXT812(0);
    auVar130._12_4_ = 0;
    auVar157 = maxps(*(undefined1 (*) [16])(ray + 0x30),auVar130);
    auVar35._8_4_ = local_1098._8_4_;
    auVar35._0_8_ = local_1098._0_8_;
    auVar35._12_4_ = local_1098._12_4_;
    auVar137._0_8_ =
         CONCAT44(-(uint)(auVar87._4_4_ < 0.0),-(uint)(auVar87._0_4_ < 0.0)) & 0x100000001;
    auVar137._8_4_ = -(uint)(auVar87._8_4_ < 0.0) & 1;
    auVar137._12_4_ = -(uint)(auVar87._12_4_ < 0.0) & 1;
    local_10a8 = maxps(*(undefined1 (*) [16])(ray + 0x80),auVar130);
    auVar143._0_8_ =
         CONCAT44(-(uint)(auVar105._4_4_ < 0.0),-(uint)(auVar105._0_4_ < 0.0)) & 0x200000002;
    auVar143._8_4_ = -(uint)(auVar105._8_4_ < 0.0) & 2;
    auVar143._12_4_ = -(uint)(auVar105._12_4_ < 0.0) & 2;
    auVar87._8_4_ = -(uint)(auVar106._8_4_ < 0.0) & 4;
    auVar87._0_8_ =
         CONCAT44(-(uint)(auVar106._4_4_ < 0.0),-(uint)(auVar106._0_4_ < 0.0)) & 0x400000004;
    auVar87._12_4_ = -(uint)(auVar106._12_4_ < 0.0) & 4;
    local_10b8 = auVar85 ^ (undefined1  [16])bi_1.field_0 | auVar87 | auVar143 | auVar137;
    local_1048 = fVar145;
    fStack_1044 = fVar146;
    fStack_1040 = fVar147;
    fStack_103c = fVar148;
    local_1058 = fVar149;
    fStack_1054 = fVar150;
    fStack_1050 = fVar151;
    fStack_104c = fVar152;
    local_1068 = fVar153;
    fStack_1064 = fVar154;
    fStack_1060 = fVar155;
    fStack_105c = fVar156;
    local_1078 = fVar122;
    fStack_1074 = fVar124;
    fStack_1070 = fVar126;
    fStack_106c = fVar128;
    local_1088 = auVar144;
    do {
      lVar18 = 0;
      if (pSVar21 != (StackItemT<embree::NodeRefPtr<4>_> *)0x0) {
        for (; ((ulong)pSVar21 >> lVar18 & 1) == 0; lVar18 = lVar18 + 1) {
        }
      }
      iVar31 = *(int *)(local_10b8 + lVar18 * 4);
      auVar36._0_8_ =
           CONCAT44(-(uint)(iVar31 == local_10b8._4_4_),-(uint)(iVar31 == local_10b8._0_4_));
      auVar36._8_4_ = -(uint)(iVar31 == local_10b8._8_4_);
      auVar36._12_4_ = -(uint)(iVar31 == local_10b8._12_4_);
      uVar20 = movmskps((int)lVar18,auVar36);
      pSVar21 = (StackItemT<embree::NodeRefPtr<4>_> *)
                (~CONCAT44((int)((ulong)lVar18 >> 0x20),uVar20) & (ulong)pSVar21);
      auVar139._4_4_ = fVar146;
      auVar139._0_4_ = fVar145;
      auVar139._8_4_ = fVar147;
      auVar139._12_4_ = fVar148;
      auVar85 = blendvps(_DAT_01f7a9f0,auVar139,auVar36);
      auVar69._4_4_ = auVar85._0_4_;
      auVar69._0_4_ = auVar85._4_4_;
      auVar69._8_4_ = auVar85._12_4_;
      auVar69._12_4_ = auVar85._8_4_;
      auVar85 = minps(auVar69,auVar85);
      auVar86._0_8_ = auVar85._8_8_;
      auVar86._8_4_ = auVar85._0_4_;
      auVar86._12_4_ = auVar85._4_4_;
      auVar87 = minps(auVar86,auVar85);
      auVar70._8_4_ = auVar36._8_4_;
      auVar70._0_8_ = auVar36._0_8_;
      auVar70._12_4_ = auVar36._12_4_;
      auVar9._4_4_ = fVar150;
      auVar9._0_4_ = fVar149;
      auVar9._8_4_ = fVar151;
      auVar9._12_4_ = fVar152;
      auVar85 = blendvps(_DAT_01f7a9f0,auVar9,auVar36);
      auVar37._4_4_ = auVar85._0_4_;
      auVar37._0_4_ = auVar85._4_4_;
      auVar37._8_4_ = auVar85._12_4_;
      auVar37._12_4_ = auVar85._8_4_;
      auVar85 = minps(auVar37,auVar85);
      auVar95._0_8_ = auVar85._8_8_;
      auVar95._8_4_ = auVar85._0_4_;
      auVar95._12_4_ = auVar85._4_4_;
      auVar85 = minps(auVar95,auVar85);
      auVar38._8_4_ = auVar36._8_4_;
      auVar38._0_8_ = auVar36._0_8_;
      auVar38._12_4_ = auVar36._12_4_;
      auVar11._4_4_ = fVar154;
      auVar11._0_4_ = fVar153;
      auVar11._8_4_ = fVar155;
      auVar11._12_4_ = fVar156;
      auVar105 = blendvps(_DAT_01f7a9f0,auVar11,auVar38);
      auVar87 = insertps(auVar87,auVar85,0x1c);
      auVar39._4_4_ = auVar105._0_4_;
      auVar39._0_4_ = auVar105._4_4_;
      auVar39._8_4_ = auVar105._12_4_;
      auVar39._12_4_ = auVar105._8_4_;
      auVar85 = minps(auVar39,auVar105);
      auVar96._0_8_ = auVar85._8_8_;
      auVar96._8_4_ = auVar85._0_4_;
      auVar96._12_4_ = auVar85._4_4_;
      auVar85 = minps(auVar96,auVar85);
      auVar87 = insertps(auVar87,auVar85,0x20);
      auVar40._8_4_ = auVar36._8_4_;
      auVar40._0_8_ = auVar36._0_8_;
      auVar40._12_4_ = auVar36._12_4_;
      auVar8._4_4_ = fVar146;
      auVar8._0_4_ = fVar145;
      auVar8._8_4_ = fVar147;
      auVar8._12_4_ = fVar148;
      auVar85 = blendvps(_DAT_01f7aa00,auVar8,auVar40);
      auVar41._4_4_ = auVar85._0_4_;
      auVar41._0_4_ = auVar85._4_4_;
      auVar41._8_4_ = auVar85._12_4_;
      auVar41._12_4_ = auVar85._8_4_;
      auVar85 = maxps(auVar41,auVar85);
      auVar97._0_8_ = auVar85._8_8_;
      auVar97._8_4_ = auVar85._0_4_;
      auVar97._12_4_ = auVar85._4_4_;
      auVar105 = maxps(auVar97,auVar85);
      auVar42._8_4_ = auVar36._8_4_;
      auVar42._0_8_ = auVar36._0_8_;
      auVar42._12_4_ = auVar36._12_4_;
      auVar10._4_4_ = fVar150;
      auVar10._0_4_ = fVar149;
      auVar10._8_4_ = fVar151;
      auVar10._12_4_ = fVar152;
      auVar85 = blendvps(_DAT_01f7aa00,auVar10,auVar42);
      auVar43._4_4_ = auVar85._0_4_;
      auVar43._0_4_ = auVar85._4_4_;
      auVar43._8_4_ = auVar85._12_4_;
      auVar43._12_4_ = auVar85._8_4_;
      auVar85 = maxps(auVar43,auVar85);
      auVar98._0_8_ = auVar85._8_8_;
      auVar98._8_4_ = auVar85._0_4_;
      auVar98._12_4_ = auVar85._4_4_;
      auVar85 = maxps(auVar98,auVar85);
      auVar44._8_4_ = auVar36._8_4_;
      auVar44._0_8_ = auVar36._0_8_;
      auVar44._12_4_ = auVar36._12_4_;
      auVar12._4_4_ = fVar154;
      auVar12._0_4_ = fVar153;
      auVar12._8_4_ = fVar155;
      auVar12._12_4_ = fVar156;
      auVar106 = blendvps(_DAT_01f7aa00,auVar12,auVar44);
      auVar105 = insertps(auVar105,auVar85,0x1c);
      auVar45._4_4_ = auVar106._0_4_;
      auVar45._0_4_ = auVar106._4_4_;
      auVar45._8_4_ = auVar106._12_4_;
      auVar45._12_4_ = auVar106._8_4_;
      auVar85 = maxps(auVar45,auVar106);
      auVar99._0_8_ = auVar85._8_8_;
      auVar99._8_4_ = auVar85._0_4_;
      auVar99._12_4_ = auVar85._4_4_;
      auVar85 = maxps(auVar99,auVar85);
      auVar130 = insertps(auVar105,auVar85,0x20);
      auVar46._8_4_ = auVar36._8_4_;
      auVar46._0_8_ = auVar36._0_8_;
      auVar46._12_4_ = auVar36._12_4_;
      auVar85 = blendvps(_DAT_01f7a9f0,auVar144,auVar46);
      auVar47._4_4_ = auVar85._0_4_;
      auVar47._0_4_ = auVar85._4_4_;
      auVar47._8_4_ = auVar85._12_4_;
      auVar47._12_4_ = auVar85._8_4_;
      auVar85 = minps(auVar47,auVar85);
      auVar138._0_8_ = auVar85._8_8_;
      auVar138._8_4_ = auVar85._0_4_;
      auVar138._12_4_ = auVar85._4_4_;
      auVar106 = minps(auVar138,auVar85);
      auVar48._8_4_ = auVar36._8_4_;
      auVar48._0_8_ = auVar36._0_8_;
      auVar48._12_4_ = auVar36._12_4_;
      auVar85 = blendvps(_DAT_01f7a9f0,auVar35,auVar48);
      auVar49._4_4_ = auVar85._0_4_;
      auVar49._0_4_ = auVar85._4_4_;
      auVar49._8_4_ = auVar85._12_4_;
      auVar49._12_4_ = auVar85._8_4_;
      auVar85 = minps(auVar49,auVar85);
      auVar100._0_8_ = auVar85._8_8_;
      auVar100._8_4_ = auVar85._0_4_;
      auVar100._12_4_ = auVar85._4_4_;
      auVar85 = minps(auVar100,auVar85);
      auVar50._8_4_ = auVar36._8_4_;
      auVar50._0_8_ = auVar36._0_8_;
      auVar50._12_4_ = auVar36._12_4_;
      auVar13._4_4_ = fVar124;
      auVar13._0_4_ = fVar122;
      auVar13._8_4_ = fVar126;
      auVar13._12_4_ = fVar128;
      auVar105 = blendvps(_DAT_01f7a9f0,auVar13,auVar50);
      auVar106 = insertps(auVar106,auVar85,0x1c);
      auVar51._4_4_ = auVar105._0_4_;
      auVar51._0_4_ = auVar105._4_4_;
      auVar51._8_4_ = auVar105._12_4_;
      auVar51._12_4_ = auVar105._8_4_;
      auVar85 = minps(auVar51,auVar105);
      auVar101._0_8_ = auVar85._8_8_;
      auVar101._8_4_ = auVar85._0_4_;
      auVar101._12_4_ = auVar85._4_4_;
      auVar85 = minps(auVar101,auVar85);
      auVar139 = insertps(auVar106,auVar85,0x20);
      auVar52._8_4_ = auVar36._8_4_;
      auVar52._0_8_ = auVar36._0_8_;
      auVar52._12_4_ = auVar36._12_4_;
      auVar85 = blendvps(_DAT_01f7aa00,auVar144,auVar52);
      auVar53._4_4_ = auVar85._0_4_;
      auVar53._0_4_ = auVar85._4_4_;
      auVar53._8_4_ = auVar85._12_4_;
      auVar53._12_4_ = auVar85._8_4_;
      auVar85 = maxps(auVar53,auVar85);
      auVar131._0_8_ = auVar85._8_8_;
      auVar131._8_4_ = auVar85._0_4_;
      auVar131._12_4_ = auVar85._4_4_;
      auVar106 = maxps(auVar131,auVar85);
      auVar54._8_4_ = auVar36._8_4_;
      auVar54._0_8_ = auVar36._0_8_;
      auVar54._12_4_ = auVar36._12_4_;
      auVar85 = blendvps(_DAT_01f7aa00,auVar35,auVar54);
      auVar55._4_4_ = auVar85._0_4_;
      auVar55._0_4_ = auVar85._4_4_;
      auVar55._8_4_ = auVar85._12_4_;
      auVar55._12_4_ = auVar85._8_4_;
      auVar85 = maxps(auVar55,auVar85);
      auVar107._0_8_ = auVar85._8_8_;
      auVar107._8_4_ = auVar85._0_4_;
      auVar107._12_4_ = auVar85._4_4_;
      auVar85 = maxps(auVar107,auVar85);
      auVar56._8_4_ = auVar36._8_4_;
      auVar56._0_8_ = auVar36._0_8_;
      auVar56._12_4_ = auVar36._12_4_;
      auVar14._4_4_ = fVar124;
      auVar14._0_4_ = fVar122;
      auVar14._8_4_ = fVar126;
      auVar14._12_4_ = fVar128;
      auVar105 = blendvps(_DAT_01f7aa00,auVar14,auVar56);
      auVar106 = insertps(auVar106,auVar85,0x1c);
      auVar57._4_4_ = auVar105._0_4_;
      auVar57._0_4_ = auVar105._4_4_;
      auVar57._8_4_ = auVar105._12_4_;
      auVar57._12_4_ = auVar105._8_4_;
      auVar85 = maxps(auVar57,auVar105);
      auVar108._0_8_ = auVar85._8_8_;
      auVar108._8_4_ = auVar85._0_4_;
      auVar108._12_4_ = auVar85._4_4_;
      auVar85 = maxps(auVar108,auVar85);
      auVar143 = insertps(auVar106,auVar85,0x20);
      auVar58._8_4_ = auVar36._8_4_;
      auVar58._0_8_ = auVar36._0_8_;
      auVar58._12_4_ = auVar36._12_4_;
      auVar85 = blendvps(_DAT_01f7a9f0,auVar157,auVar58);
      auVar59._4_4_ = auVar85._0_4_;
      auVar59._0_4_ = auVar85._4_4_;
      auVar59._8_4_ = auVar85._12_4_;
      auVar59._12_4_ = auVar85._8_4_;
      auVar85 = minps(auVar59,auVar85);
      auVar60._8_4_ = auVar36._8_4_;
      auVar60._0_8_ = auVar36._0_8_;
      auVar60._12_4_ = auVar36._12_4_;
      bi_9.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                     blendvps(_DAT_01f7aa00,local_10a8,auVar60);
      auVar109._4_4_ = bi_9.field_0._0_4_;
      auVar109._0_4_ = bi_9.field_0._4_4_;
      auVar109._8_4_ = bi_9.field_0._12_4_;
      auVar109._12_4_ = bi_9.field_0._8_4_;
      auVar106 = maxps(auVar109,(undefined1  [16])bi_9.field_0);
      iVar31 = -(uint)(0.0 <= auVar139._0_4_);
      iVar32 = -(uint)(0.0 <= auVar139._4_4_);
      iVar33 = -(uint)(0.0 <= auVar139._8_4_);
      iVar34 = -(uint)(0.0 <= auVar139._12_4_);
      auVar61._4_4_ = iVar32;
      auVar61._0_4_ = iVar31;
      auVar61._8_4_ = iVar33;
      auVar61._12_4_ = iVar34;
      auVar105 = blendvps(auVar143,auVar139,auVar61);
      auVar137 = blendvps(auVar87,auVar130,auVar61);
      auVar87 = blendvps(auVar130,auVar87,auVar61);
      auVar62._8_4_ = auVar106._0_4_;
      auVar62._0_8_ = auVar106._8_8_;
      auVar62._12_4_ = auVar106._4_4_;
      fVar67 = auVar105._0_4_;
      local_fd8 = auVar105._4_4_;
      local_11a8 = maxps(auVar62,auVar106);
      uVar27 = (ulong)(local_fd8 < 0.0) << 4 | 0x20;
      local_f98 = auVar105._8_4_;
      uVar30 = (ulong)(local_f98 < 0.0) << 4 | 0x40;
      auVar63._4_4_ = iVar32;
      auVar63._0_4_ = iVar31;
      auVar63._8_4_ = iVar33;
      auVar63._12_4_ = iVar34;
      auVar105 = blendvps(auVar139,auVar143,auVar63);
      local_fc8 = auVar137._0_4_ * fVar67;
      local_fe8 = auVar137._4_4_ * local_fd8;
      local_fa8 = auVar137._8_4_ * local_f98;
      local_ff8 = auVar105._0_4_;
      local_1008 = auVar87._0_4_ * local_ff8;
      local_1018 = auVar105._4_4_;
      local_1028 = auVar87._4_4_ * local_1018;
      local_f88 = auVar105._8_4_;
      fStack_1134 = auVar87._8_4_ * local_f88;
      pSVar17 = *(StackItemT<embree::NodeRefPtr<4>_> **)&pAVar7[1].bounds.bounds0.lower.field_0;
      stack[0].ptr.ptr = (size_t)pSVar17;
      stack[0].dist = 0;
      local_fb8 = fVar67;
      fStack_fb4 = fVar67;
      fStack_fb0 = fVar67;
      fStack_fac = fVar67;
      fStack_fc4 = local_fc8;
      fStack_fc0 = local_fc8;
      fStack_fbc = local_fc8;
      fStack_fd4 = local_fd8;
      fStack_fd0 = local_fd8;
      fStack_fcc = local_fd8;
      fStack_fe4 = local_fe8;
      fStack_fe0 = local_fe8;
      fStack_fdc = local_fe8;
      fStack_f94 = local_f98;
      fStack_f90 = local_f98;
      fStack_f8c = local_f98;
      fStack_fa4 = local_fa8;
      fStack_fa0 = local_fa8;
      fStack_f9c = local_fa8;
      fStack_ff4 = local_ff8;
      fStack_ff0 = local_ff8;
      fStack_fec = local_ff8;
      fStack_1004 = local_1008;
      fStack_1000 = local_1008;
      fStack_ffc = local_1008;
      local_1128 = blendvps(_DAT_01f7a9f0,auVar157,auVar70);
      fStack_1014 = local_1018;
      fStack_1010 = local_1018;
      fStack_100c = local_1018;
      local_1148._0_4_ = auVar85._0_4_;
      local_1148._8_4_ = auVar85._8_4_;
      auVar64._4_4_ = local_1148._0_4_;
      auVar64._0_4_ = local_1148._0_4_;
      auVar64._8_4_ = local_1148._0_4_;
      auVar64._12_4_ = local_1148._0_4_;
      auVar71._4_4_ = local_1148._8_4_;
      auVar71._0_4_ = local_1148._8_4_;
      auVar71._8_4_ = local_1148._8_4_;
      auVar71._12_4_ = local_1148._8_4_;
      local_1148 = minps(auVar71,auVar64);
      fStack_1024 = local_1028;
      fStack_1020 = local_1028;
      fStack_101c = local_1028;
      fStack_f84 = local_f88;
      fStack_f80 = local_f88;
      fStack_f7c = local_f88;
      local_1138 = fStack_1134;
      fStack_1130 = fStack_1134;
      fStack_112c = fStack_1134;
      iVar34 = local_11a8._0_4_;
      pSVar24 = stack + 1;
      pSVar22 = pSVar21;
      iVar31 = iVar34;
      iVar32 = iVar34;
      iVar33 = iVar34;
      do {
        fVar68 = (float)pSVar24[-1].dist;
        pSVar24 = pSVar24 + -1;
        auVar72._4_4_ = fVar68;
        auVar72._0_4_ = fVar68;
        auVar72._8_4_ = fVar68;
        auVar72._12_4_ = fVar68;
        auVar88._4_4_ = -(uint)(fVar68 < (float)bi_9.field_0.i[1]);
        auVar88._0_4_ = -(uint)(fVar68 < (float)bi_9.field_0.i[0]);
        auVar88._8_4_ = -(uint)(fVar68 < (float)bi_9.field_0.i[2]);
        auVar88._12_4_ = -(uint)(fVar68 < (float)bi_9.field_0.i[3]);
        uVar16 = movmskps((int)pSVar17,auVar88);
        if (uVar16 != 0) {
          pSVar17 = (StackItemT<embree::NodeRefPtr<4>_> *)(ulong)uVar16;
          pSVar28 = (StackItemT<embree::NodeRefPtr<4>_> *)(pSVar24->ptr).ptr;
          while (((ulong)pSVar28 & 8) == 0) {
            pSVar22 = pSVar28 + (ulong)(fVar67 < 0.0) + 2;
            fVar68 = *(float *)&(pSVar22->ptr).ptr * local_fb8 - local_fc8;
            fVar77 = *(float *)((long)&(pSVar22->ptr).ptr + 4) * fStack_fb4 - fStack_fc4;
            fVar79 = (float)pSVar22->dist * fStack_fb0 - fStack_fc0;
            fVar81 = *(float *)&pSVar22->field_0xc * fStack_fac - fStack_fbc;
            pfVar1 = (float *)((long)&pSVar28[2].ptr.ptr + uVar27);
            fVar83 = *pfVar1 * local_fd8 - local_fe8;
            fVar89 = pfVar1[1] * fStack_fd4 - fStack_fe4;
            fVar91 = pfVar1[2] * fStack_fd0 - fStack_fe0;
            fVar93 = pfVar1[3] * fStack_fcc - fStack_fdc;
            uVar84 = (uint)((int)fVar83 < (int)fVar68) * (int)fVar68 |
                     (uint)((int)fVar83 >= (int)fVar68) * (int)fVar83;
            uVar90 = (uint)((int)fVar89 < (int)fVar77) * (int)fVar77 |
                     (uint)((int)fVar89 >= (int)fVar77) * (int)fVar89;
            uVar92 = (uint)((int)fVar91 < (int)fVar79) * (int)fVar79 |
                     (uint)((int)fVar91 >= (int)fVar79) * (int)fVar91;
            uVar94 = (uint)((int)fVar93 < (int)fVar81) * (int)fVar81 |
                     (uint)((int)fVar93 >= (int)fVar81) * (int)fVar93;
            pfVar1 = (float *)((long)&pSVar28[2].ptr.ptr + uVar30);
            fVar68 = *pfVar1 * local_f98 - local_fa8;
            fVar77 = pfVar1[1] * fStack_f94 - fStack_fa4;
            fVar79 = pfVar1[2] * fStack_f90 - fStack_fa0;
            fVar81 = pfVar1[3] * fStack_f8c - fStack_f9c;
            uVar16 = (uint)((int)fVar68 < (int)local_1148._0_4_) * local_1148._0_4_ |
                     (uint)((int)fVar68 >= (int)local_1148._0_4_) * (int)fVar68;
            uVar78 = (uint)((int)fVar77 < (int)local_1148._4_4_) * local_1148._4_4_ |
                     (uint)((int)fVar77 >= (int)local_1148._4_4_) * (int)fVar77;
            uVar80 = (uint)((int)fVar79 < (int)local_1148._8_4_) * local_1148._8_4_ |
                     (uint)((int)fVar79 >= (int)local_1148._8_4_) * (int)fVar79;
            uVar82 = (uint)((int)fVar81 < (int)local_1148._12_4_) * local_1148._12_4_ |
                     (uint)((int)fVar81 >= (int)local_1148._12_4_) * (int)fVar81;
            fmin.field_0.i[0] =
                 ((int)uVar16 < (int)uVar84) * uVar84 | ((int)uVar16 >= (int)uVar84) * uVar16;
            fmin.field_0.i[1] =
                 ((int)uVar78 < (int)uVar90) * uVar90 | ((int)uVar78 >= (int)uVar90) * uVar78;
            fmin.field_0.i[2] =
                 ((int)uVar80 < (int)uVar92) * uVar92 | ((int)uVar80 >= (int)uVar92) * uVar80;
            fmin.field_0.i[3] =
                 ((int)uVar82 < (int)uVar94) * uVar94 | ((int)uVar82 >= (int)uVar94) * uVar82;
            pfVar1 = (float *)((long)&pSVar28[2].ptr.ptr + ((ulong)(fVar67 < 0.0) * 0x10 ^ 0x10));
            fVar68 = *pfVar1 * local_ff8 - local_1008;
            fVar77 = pfVar1[1] * fStack_ff4 - fStack_1004;
            fVar79 = pfVar1[2] * fStack_ff0 - fStack_1000;
            fVar81 = pfVar1[3] * fStack_fec - fStack_ffc;
            pfVar1 = (float *)((long)&pSVar28[2].ptr.ptr + (uVar27 ^ 0x10));
            fVar83 = *pfVar1 * local_1018 - local_1028;
            fVar89 = pfVar1[1] * fStack_1014 - fStack_1024;
            fVar91 = pfVar1[2] * fStack_1010 - fStack_1020;
            fVar93 = pfVar1[3] * fStack_100c - fStack_101c;
            uVar84 = (uint)((int)fVar68 < (int)fVar83) * (int)fVar68 |
                     (uint)((int)fVar68 >= (int)fVar83) * (int)fVar83;
            uVar90 = (uint)((int)fVar77 < (int)fVar89) * (int)fVar77 |
                     (uint)((int)fVar77 >= (int)fVar89) * (int)fVar89;
            uVar92 = (uint)((int)fVar79 < (int)fVar91) * (int)fVar79 |
                     (uint)((int)fVar79 >= (int)fVar91) * (int)fVar91;
            uVar94 = (uint)((int)fVar81 < (int)fVar93) * (int)fVar81 |
                     (uint)((int)fVar81 >= (int)fVar93) * (int)fVar93;
            pfVar1 = (float *)((long)&pSVar28[2].ptr.ptr + (uVar30 ^ 0x10));
            fVar68 = *pfVar1 * local_f88 - local_1138;
            fVar77 = pfVar1[1] * fStack_f84 - fStack_1134;
            fVar79 = pfVar1[2] * fStack_f80 - fStack_1130;
            fVar81 = pfVar1[3] * fStack_f7c - fStack_112c;
            uVar16 = (uint)(iVar34 < (int)fVar68) * iVar34 |
                     (uint)(iVar34 >= (int)fVar68) * (int)fVar68;
            uVar78 = (uint)(iVar31 < (int)fVar77) * iVar31 |
                     (uint)(iVar31 >= (int)fVar77) * (int)fVar77;
            uVar80 = (uint)(iVar32 < (int)fVar79) * iVar32 |
                     (uint)(iVar32 >= (int)fVar79) * (int)fVar79;
            uVar82 = (uint)(iVar33 < (int)fVar81) * iVar33 |
                     (uint)(iVar33 >= (int)fVar81) * (int)fVar81;
            auVar73._4_4_ =
                 -(uint)(fmin.field_0.v[1] <=
                        (float)(((int)uVar90 < (int)uVar78) * uVar90 |
                               ((int)uVar90 >= (int)uVar78) * uVar78));
            auVar73._0_4_ =
                 -(uint)(fmin.field_0.v[0] <=
                        (float)(((int)uVar84 < (int)uVar16) * uVar84 |
                               ((int)uVar84 >= (int)uVar16) * uVar16));
            auVar73._8_4_ =
                 -(uint)(fmin.field_0.v[2] <=
                        (float)(((int)uVar92 < (int)uVar80) * uVar92 |
                               ((int)uVar92 >= (int)uVar80) * uVar80));
            auVar73._12_4_ =
                 -(uint)(fmin.field_0.v[3] <=
                        (float)(((int)uVar94 < (int)uVar82) * uVar94 |
                               ((int)uVar94 >= (int)uVar82) * uVar82));
            uVar16 = movmskps((int)uVar27,auVar73);
            pSVar22 = (StackItemT<embree::NodeRefPtr<4>_> *)(ulong)uVar16;
            if (uVar16 == 0) goto LAB_00294b56;
            uVar23 = (ulong)(byte)uVar16;
            uVar26 = 0;
            pSVar22 = (StackItemT<embree::NodeRefPtr<4>_> *)0x8;
            auVar72 = _DAT_01f7a9f0;
            do {
              lVar18 = 0;
              if (uVar23 != 0) {
                for (; (uVar23 >> lVar18 & 1) == 0; lVar18 = lVar18 + 1) {
                }
              }
              fVar68 = *(float *)((long)&pSVar28[2].ptr.ptr + lVar18 * 4);
              fVar77 = *(float *)((long)&pSVar28[3].ptr.ptr + lVar18 * 4);
              fVar79 = *(float *)((long)&pSVar28[4].ptr.ptr + lVar18 * 4);
              fVar81 = *(float *)((long)&pSVar28[5].ptr.ptr + lVar18 * 4);
              fVar104 = (fVar68 - fVar145) * auVar144._0_4_;
              fVar111 = (fVar68 - fVar146) * auVar144._4_4_;
              fVar112 = (fVar68 - fVar147) * auVar144._8_4_;
              fVar113 = (fVar68 - fVar148) * auVar144._12_4_;
              fVar114 = (fVar79 - fVar149) * auVar35._0_4_;
              fVar115 = (fVar79 - fVar150) * auVar35._4_4_;
              fVar116 = (fVar79 - fVar151) * auVar35._8_4_;
              fVar117 = (fVar79 - fVar152) * auVar35._12_4_;
              fVar68 = *(float *)((long)&pSVar28[6].ptr.ptr + lVar18 * 4);
              fVar118 = (fVar68 - fVar153) * fVar122;
              fVar119 = (fVar68 - fVar154) * fVar124;
              fVar120 = (fVar68 - fVar155) * fVar126;
              fVar121 = (fVar68 - fVar156) * fVar128;
              fVar89 = (fVar77 - fVar145) * auVar144._0_4_;
              fVar91 = (fVar77 - fVar146) * auVar144._4_4_;
              fVar93 = (fVar77 - fVar147) * auVar144._8_4_;
              fVar103 = (fVar77 - fVar148) * auVar144._12_4_;
              fVar77 = (fVar81 - fVar149) * auVar35._0_4_;
              fVar79 = (fVar81 - fVar150) * auVar35._4_4_;
              fVar83 = (fVar81 - fVar151) * auVar35._8_4_;
              fVar81 = (fVar81 - fVar152) * auVar35._12_4_;
              fVar68 = *(float *)((long)&pSVar28[7].ptr.ptr + lVar18 * 4);
              fVar123 = (fVar68 - fVar153) * fVar122;
              fVar125 = (fVar68 - fVar154) * fVar124;
              fVar127 = (fVar68 - fVar155) * fVar126;
              fVar68 = (fVar68 - fVar156) * fVar128;
              uVar16 = (uint)((int)fVar89 < (int)fVar104) * (int)fVar89 |
                       (uint)((int)fVar89 >= (int)fVar104) * (int)fVar104;
              uVar78 = (uint)((int)fVar91 < (int)fVar111) * (int)fVar91 |
                       (uint)((int)fVar91 >= (int)fVar111) * (int)fVar111;
              uVar80 = (uint)((int)fVar93 < (int)fVar112) * (int)fVar93 |
                       (uint)((int)fVar93 >= (int)fVar112) * (int)fVar112;
              uVar82 = (uint)((int)fVar103 < (int)fVar113) * (int)fVar103 |
                       (uint)((int)fVar103 >= (int)fVar113) * (int)fVar113;
              uVar84 = (uint)((int)fVar77 < (int)fVar114) * (int)fVar77 |
                       (uint)((int)fVar77 >= (int)fVar114) * (int)fVar114;
              uVar90 = (uint)((int)fVar79 < (int)fVar115) * (int)fVar79 |
                       (uint)((int)fVar79 >= (int)fVar115) * (int)fVar115;
              uVar92 = (uint)((int)fVar83 < (int)fVar116) * (int)fVar83 |
                       (uint)((int)fVar83 >= (int)fVar116) * (int)fVar116;
              uVar94 = (uint)((int)fVar81 < (int)fVar117) * (int)fVar81 |
                       (uint)((int)fVar81 >= (int)fVar117) * (int)fVar117;
              uVar136 = ((int)uVar84 < (int)uVar16) * uVar16 | ((int)uVar84 >= (int)uVar16) * uVar84
              ;
              uVar140 = ((int)uVar90 < (int)uVar78) * uVar78 | ((int)uVar90 >= (int)uVar78) * uVar90
              ;
              uVar141 = ((int)uVar92 < (int)uVar80) * uVar80 | ((int)uVar92 >= (int)uVar80) * uVar92
              ;
              uVar142 = ((int)uVar94 < (int)uVar82) * uVar82 | ((int)uVar94 >= (int)uVar82) * uVar94
              ;
              uVar16 = (uint)((int)fVar123 < (int)fVar118) * (int)fVar123 |
                       (uint)((int)fVar123 >= (int)fVar118) * (int)fVar118;
              uVar78 = (uint)((int)fVar125 < (int)fVar119) * (int)fVar125 |
                       (uint)((int)fVar125 >= (int)fVar119) * (int)fVar119;
              uVar80 = (uint)((int)fVar127 < (int)fVar120) * (int)fVar127 |
                       (uint)((int)fVar127 >= (int)fVar120) * (int)fVar120;
              uVar82 = (uint)((int)fVar68 < (int)fVar121) * (int)fVar68 |
                       (uint)((int)fVar68 >= (int)fVar121) * (int)fVar121;
              uVar129 = (uint)((int)uVar16 < (int)local_1128._0_4_) * local_1128._0_4_ |
                        ((int)uVar16 >= (int)local_1128._0_4_) * uVar16;
              uVar133 = (uint)((int)uVar78 < (int)local_1128._4_4_) * local_1128._4_4_ |
                        ((int)uVar78 >= (int)local_1128._4_4_) * uVar78;
              uVar134 = (uint)((int)uVar80 < (int)local_1128._8_4_) * local_1128._8_4_ |
                        ((int)uVar80 >= (int)local_1128._8_4_) * uVar80;
              uVar135 = (uint)((int)uVar82 < (int)local_1128._12_4_) * local_1128._12_4_ |
                        ((int)uVar82 >= (int)local_1128._12_4_) * uVar82;
              uVar84 = (uint)((int)fVar89 < (int)fVar104) * (int)fVar104 |
                       (uint)((int)fVar89 >= (int)fVar104) * (int)fVar89;
              uVar90 = (uint)((int)fVar91 < (int)fVar111) * (int)fVar111 |
                       (uint)((int)fVar91 >= (int)fVar111) * (int)fVar91;
              uVar92 = (uint)((int)fVar93 < (int)fVar112) * (int)fVar112 |
                       (uint)((int)fVar93 >= (int)fVar112) * (int)fVar93;
              uVar94 = (uint)((int)fVar103 < (int)fVar113) * (int)fVar113 |
                       (uint)((int)fVar103 >= (int)fVar113) * (int)fVar103;
              uVar16 = (uint)((int)fVar77 < (int)fVar114) * (int)fVar114 |
                       (uint)((int)fVar77 >= (int)fVar114) * (int)fVar77;
              uVar78 = (uint)((int)fVar79 < (int)fVar115) * (int)fVar115 |
                       (uint)((int)fVar79 >= (int)fVar115) * (int)fVar79;
              uVar80 = (uint)((int)fVar83 < (int)fVar116) * (int)fVar116 |
                       (uint)((int)fVar83 >= (int)fVar116) * (int)fVar83;
              uVar82 = (uint)((int)fVar81 < (int)fVar117) * (int)fVar117 |
                       (uint)((int)fVar81 >= (int)fVar117) * (int)fVar81;
              uVar16 = ((int)uVar84 < (int)uVar16) * uVar84 | ((int)uVar84 >= (int)uVar16) * uVar16;
              uVar78 = ((int)uVar90 < (int)uVar78) * uVar90 | ((int)uVar90 >= (int)uVar78) * uVar78;
              uVar80 = ((int)uVar92 < (int)uVar80) * uVar92 | ((int)uVar92 >= (int)uVar80) * uVar80;
              uVar82 = ((int)uVar94 < (int)uVar82) * uVar94 | ((int)uVar94 >= (int)uVar82) * uVar82;
              uVar84 = (uint)((int)fVar123 < (int)fVar118) * (int)fVar118 |
                       (uint)((int)fVar123 >= (int)fVar118) * (int)fVar123;
              uVar90 = (uint)((int)fVar125 < (int)fVar119) * (int)fVar119 |
                       (uint)((int)fVar125 >= (int)fVar119) * (int)fVar125;
              uVar92 = (uint)((int)fVar127 < (int)fVar120) * (int)fVar120 |
                       (uint)((int)fVar127 >= (int)fVar120) * (int)fVar127;
              uVar94 = (uint)((int)fVar68 < (int)fVar121) * (int)fVar121 |
                       (uint)((int)fVar68 >= (int)fVar121) * (int)fVar68;
              uVar84 = (uint)(bi_9.field_0.i[0] < (int)uVar84) * bi_9.field_0.i[0] |
                       (bi_9.field_0.i[0] >= (int)uVar84) * uVar84;
              uVar90 = (uint)(bi_9.field_0.i[1] < (int)uVar90) * bi_9.field_0.i[1] |
                       (bi_9.field_0.i[1] >= (int)uVar90) * uVar90;
              uVar92 = (uint)(bi_9.field_0.i[2] < (int)uVar92) * bi_9.field_0.i[2] |
                       (bi_9.field_0.i[2] >= (int)uVar92) * uVar92;
              uVar94 = (uint)(bi_9.field_0.i[3] < (int)uVar94) * bi_9.field_0.i[3] |
                       (bi_9.field_0.i[3] >= (int)uVar94) * uVar94;
              auVar132._4_4_ =
                   -(uint)((float)(((int)uVar133 < (int)uVar140) * uVar140 |
                                  ((int)uVar133 >= (int)uVar140) * uVar133) <=
                          (float)(((int)uVar78 < (int)uVar90) * uVar78 |
                                 ((int)uVar78 >= (int)uVar90) * uVar90));
              auVar132._0_4_ =
                   -(uint)((float)(((int)uVar129 < (int)uVar136) * uVar136 |
                                  ((int)uVar129 >= (int)uVar136) * uVar129) <=
                          (float)(((int)uVar16 < (int)uVar84) * uVar16 |
                                 ((int)uVar16 >= (int)uVar84) * uVar84));
              auVar132._8_4_ =
                   -(uint)((float)(((int)uVar134 < (int)uVar141) * uVar141 |
                                  ((int)uVar134 >= (int)uVar141) * uVar134) <=
                          (float)(((int)uVar80 < (int)uVar92) * uVar80 |
                                 ((int)uVar80 >= (int)uVar92) * uVar92));
              auVar132._12_4_ =
                   -(uint)((float)(((int)uVar135 < (int)uVar142) * uVar142 |
                                  ((int)uVar135 >= (int)uVar142) * uVar135) <=
                          (float)(((int)uVar82 < (int)uVar94) * uVar82 |
                                 ((int)uVar82 >= (int)uVar94) * uVar94));
              uVar16 = movmskps((int)valid_i,auVar132);
              valid_i = (vint<4> *)(ulong)uVar16;
              pSVar29 = pSVar22;
              if (uVar16 != 0) {
                fVar68 = fmin.field_0.v[lVar18];
                auVar85 = ZEXT416((uint)fVar68);
                pSVar29 = (StackItemT<embree::NodeRefPtr<4>_> *)(&pSVar28->ptr)[lVar18].ptr;
                auVar110._4_4_ = -(uint)(fVar68 < auVar72._4_4_);
                auVar110._0_4_ = -(uint)(fVar68 < auVar72._0_4_);
                auVar110._8_4_ = -(uint)(fVar68 < auVar72._8_4_);
                auVar110._12_4_ = -(uint)(fVar68 < auVar72._12_4_);
                uVar16 = movmskps(uVar16,auVar110);
                valid_i = (vint<4> *)(ulong)uVar16;
                if (uVar16 == 0) {
                  (pSVar24->ptr).ptr = (size_t)pSVar29;
                  pSVar29 = pSVar22;
                  auVar74 = auVar72;
                }
                else {
                  if (pSVar22 == (StackItemT<embree::NodeRefPtr<4>_> *)0x8) {
                    auVar72._8_4_ = fVar68;
                    auVar72._0_8_ = CONCAT44(fVar68,fVar68);
                    auVar72._12_4_ = fVar68;
                    goto LAB_002948e9;
                  }
                  (pSVar24->ptr).ptr = (size_t)pSVar22;
                  auVar74._8_4_ = fVar68;
                  auVar74._0_8_ = CONCAT44(fVar68,fVar68);
                  auVar74._12_4_ = fVar68;
                  auVar85 = auVar72;
                }
                auVar72 = auVar74;
                uVar26 = uVar26 + 1;
                pSVar24->dist = auVar85._0_4_;
                pSVar24 = pSVar24 + 1;
              }
LAB_002948e9:
              uVar23 = uVar23 & uVar23 - 1;
              pSVar22 = pSVar29;
            } while (uVar23 != 0);
            pSVar22 = (StackItemT<embree::NodeRefPtr<4>_> *)0x0;
            if (pSVar29 == (StackItemT<embree::NodeRefPtr<4>_> *)0x8) goto LAB_00294b56;
            pSVar17 = pSVar28;
            pSVar28 = pSVar29;
            if (1 < uVar26) {
              pSVar17 = pSVar24 + -2;
              pSVar22 = pSVar24 + -1;
              if (pSVar24[-2].dist < pSVar24[-1].dist) {
                SVar4 = *pSVar17;
                pSVar24[-2].dist = pSVar24[-1].dist;
                (pSVar17->ptr).ptr = (pSVar22->ptr).ptr;
                local_1198.valid = (int *)SVar4.ptr.ptr;
                (pSVar22->ptr).ptr = (size_t)local_1198.valid;
                local_1198.geometryUserPtr._0_4_ = SVar4.dist;
                pSVar24[-1].dist = (uint)local_1198.geometryUserPtr;
              }
              if (uVar26 != 2) {
                valid_i = (vint<4> *)(pSVar24 + -3);
                uVar16 = pSVar24[-3].dist;
                if (uVar16 < pSVar24[-1].dist) {
                  uVar2 = ((RTCIntersectFunctionNArguments *)valid_i)->valid;
                  uVar5 = ((RTCIntersectFunctionNArguments *)valid_i)->geometryUserPtr;
                  pSVar24[-3].dist = pSVar24[-1].dist;
                  ((RTCIntersectFunctionNArguments *)valid_i)->valid = (int *)(pSVar22->ptr).ptr;
                  (pSVar22->ptr).ptr = uVar2;
                  local_1198.geometryUserPtr._0_4_ = (uint)uVar5;
                  pSVar24[-1].dist = (uint)local_1198.geometryUserPtr;
                  uVar16 = pSVar24[-3].dist;
                }
                if (uVar16 < pSVar24[-2].dist) {
                  uVar3 = ((RTCIntersectFunctionNArguments *)valid_i)->valid;
                  uVar6 = ((RTCIntersectFunctionNArguments *)valid_i)->geometryUserPtr;
                  pSVar24[-3].dist = pSVar24[-2].dist;
                  ((RTCIntersectFunctionNArguments *)valid_i)->valid = (int *)(pSVar17->ptr).ptr;
                  (pSVar17->ptr).ptr = uVar3;
                  local_1198.geometryUserPtr._0_4_ = (uint)uVar6;
                  pSVar22 = (StackItemT<embree::NodeRefPtr<4>_> *)
                            (ulong)(uint)local_1198.geometryUserPtr;
                  pSVar24[-2].dist = (uint)local_1198.geometryUserPtr;
                }
              }
            }
          }
          auVar65._4_4_ = -(uint)(auVar72._4_4_ < (float)bi_9.field_0.i[1]);
          auVar65._0_4_ = -(uint)(auVar72._0_4_ < (float)bi_9.field_0.i[0]);
          auVar65._8_4_ = -(uint)(auVar72._8_4_ < (float)bi_9.field_0.i[2]);
          auVar65._12_4_ = -(uint)(auVar72._12_4_ < (float)bi_9.field_0.i[3]);
          iVar31 = movmskps((int)pSVar17,auVar65);
          if (iVar31 != 0) {
            lVar18 = (ulong)((uint)pSVar28 & 0xf) - 8;
            auVar158._8_8_ = pSVar22;
            auVar158._0_8_ = lVar18;
            if (lVar18 != 0) {
              lVar25 = 0;
              local_1038 = auVar65;
              do {
                local_1198.geomID = *(uint *)(((ulong)pSVar28 & 0xfffffffffffffff0) + lVar25 * 8);
                valid_i = (vint<4> *)(ulong)local_1198.geomID;
                local_1168 = (context->scene->geometries).items[(long)valid_i].ptr;
                uVar16 = local_1168->mask;
                auVar75._0_4_ = -(uint)((uVar16 & *(uint *)(ray + 0x90)) == 0);
                auVar75._4_4_ = -(uint)((uVar16 & *(uint *)(ray + 0x94)) == 0);
                auVar75._8_4_ = -(uint)((uVar16 & *(uint *)(ray + 0x98)) == 0);
                auVar75._12_4_ = -(uint)((uVar16 & *(uint *)(ray + 0x9c)) == 0);
                fmin.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)(~auVar75 & auVar65);
                iVar31 = movmskps((int)pSVar22,(undefined1  [16])fmin.field_0);
                auVar158._8_4_ = iVar31;
                auVar158._0_8_ = local_1168;
                auVar158._12_4_ = 0;
                if (iVar31 != 0) {
                  local_1198.primID =
                       *(uint *)(((ulong)pSVar28 & 0xfffffffffffffff0) + 4 + lVar25 * 8);
                  local_1198.geometryUserPtr = local_1168->userPtr;
                  local_1198.valid = (int *)&fmin;
                  local_1198.context = context->user;
                  local_1198.N = 4;
                  local_1160 = 0;
                  local_1158 = context->args;
                  pp_Var19 = (_func_int **)local_1158->intersect;
                  if (pp_Var19 == (_func_int **)0x0) {
                    pp_Var19 = local_1168[1].super_RefCount._vptr_RefCount;
                  }
                  valid_i = (vint<4> *)&local_1198;
                  local_1198.rayhit = (RTCRayHitN *)ray;
                  auVar158 = (*(code *)pp_Var19)((RTCIntersectFunctionNArguments *)valid_i);
                  auVar65 = local_1038;
                  auVar144 = local_1088;
                  fVar145 = local_1048;
                  fVar146 = fStack_1044;
                  fVar147 = fStack_1040;
                  fVar148 = fStack_103c;
                  fVar149 = local_1058;
                  fVar150 = fStack_1054;
                  fVar151 = fStack_1050;
                  fVar152 = fStack_104c;
                  fVar153 = local_1068;
                  fVar154 = fStack_1064;
                  fVar155 = fStack_1060;
                  fVar156 = fStack_105c;
                  auVar35 = local_1098;
                  fVar122 = local_1078;
                  fVar124 = fStack_1074;
                  fVar126 = fStack_1070;
                  fVar128 = fStack_106c;
                }
                pSVar22 = auVar158._8_8_;
                lVar25 = lVar25 + 1;
              } while (lVar18 != lVar25);
            }
            pSVar22 = auVar158._8_8_;
            auVar85 = *(undefined1 (*) [16])(ray + 0x80);
            auVar102._0_4_ = -(uint)(auVar85._0_4_ < (float)bi_9.field_0.i[0]) & auVar65._0_4_;
            auVar102._4_4_ = -(uint)(auVar85._4_4_ < (float)bi_9.field_0.i[1]) & auVar65._4_4_;
            auVar102._8_4_ = -(uint)(auVar85._8_4_ < (float)bi_9.field_0.i[2]) & auVar65._8_4_;
            auVar102._12_4_ = -(uint)(auVar85._12_4_ < (float)bi_9.field_0.i[3]) & auVar65._12_4_;
            iVar31 = movmskps(auVar158._0_4_,auVar102);
            if (iVar31 != 0) {
              bi_9.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                             blendvps((undefined1  [16])bi_9.field_0,auVar85,auVar65);
              auVar66._4_4_ = bi_9.field_0._0_4_;
              auVar66._0_4_ = bi_9.field_0._4_4_;
              auVar66._8_4_ = bi_9.field_0._12_4_;
              auVar66._12_4_ = bi_9.field_0._8_4_;
              auVar87 = maxps(auVar66,(undefined1  [16])bi_9.field_0);
              auVar15._4_8_ = auVar85._8_8_;
              auVar15._0_4_ = auVar87._4_4_;
              auVar76._0_8_ = auVar15._0_8_ << 0x20;
              auVar76._8_4_ = auVar87._8_4_;
              auVar76._12_4_ = auVar87._12_4_;
              local_11a8._8_8_ = auVar87._8_8_;
              local_11a8._0_8_ = auVar76._8_8_;
              if (auVar87._8_4_ <= auVar87._0_4_) {
                local_11a8._0_4_ = auVar87._0_4_;
              }
            }
          }
        }
        iVar34 = local_11a8._0_4_;
        iVar31 = iVar34;
        iVar32 = iVar34;
        iVar33 = iVar34;
LAB_00294b56:
        pSVar17 = stack;
      } while (pSVar24 != pSVar17);
    } while (pSVar21 != (StackItemT<embree::NodeRefPtr<4>_> *)0x0);
  }
  return;
}

Assistant:

__forceinline vboolf4 operator ==(const vint4& a, const vint4& b) { return _mm_castsi128_ps(_mm_cmpeq_epi32(a, b)); }